

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

bool poll_process_memory_usage(pid_t pid,ProcessStats *stats)

{
  int iVar1;
  FILE *__stream;
  long local_450;
  int64_t shared;
  int64_t resident;
  FILE *file;
  char path [1024];
  longlong values [3];
  ProcessStats *stats_local;
  pid_t pid_local;
  
  snprintf((char *)&file,0x400,"/proc/%d/statm",(ulong)(uint)pid);
  __stream = fopen((char *)&file,"r");
  if (__stream == (FILE *)0x0) {
    stats_local._7_1_ = false;
  }
  else {
    iVar1 = __isoc99_fscanf(__stream,"%lld %lld %lld",path + 0x3f8,values,values + 1);
    if (iVar1 == 3) {
      fclose(__stream);
      iVar1 = getpagesize();
      shared = (values[0] * iVar1) / 0x100000;
      iVar1 = getpagesize();
      local_450 = (values[1] * iVar1) / 0x100000;
      if (0xffffffff < shared) {
        shared = 0xffffffff;
      }
      if (0xffffffff < local_450) {
        local_450 = 0xffffffff;
      }
      stats->resident_mib = (uint32_t)shared;
      stats->shared_mib = (uint32_t)local_450;
      stats_local._7_1_ = true;
    }
    else {
      fclose(__stream);
      stats_local._7_1_ = false;
    }
  }
  return stats_local._7_1_;
}

Assistant:

static bool poll_process_memory_usage(pid_t pid, ExternalReplayer::ProcessStats &stats)
{
	long long values[3];
	char path[1024];
	snprintf(path, sizeof(path), "/proc/%d/statm", pid);
	FILE *file = fopen(path, "r");
	if (!file)
		return false;

	if (fscanf(file, "%lld %lld %lld",
	           &values[0], &values[1], &values[2]) != 3)
	{
		fclose(file);
		return false;
	}
	fclose(file);

	int64_t resident = (values[1] * getpagesize()) / (1024 * 1024);
	int64_t shared = (values[2] * getpagesize()) / (1024 * 1024);
	if (resident > UINT32_MAX)
		resident = UINT32_MAX;
	if (shared > UINT32_MAX)
		shared = UINT32_MAX;

	stats.resident_mib = resident;
	stats.shared_mib = shared;
	return true;
}